

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

void __thiscall
duckdb::TemporaryFileManager::IncreaseSizeOnDisk(TemporaryFileManager *this,idx_t bytes)

{
  atomic<unsigned_long> *paVar1;
  StringUtil *this_00;
  OutOfMemoryException *this_01;
  StringUtil *multiplier;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string data_size;
  string max;
  string used;
  
  paVar1 = this->size_on_disk;
  this_00 = (StringUtil *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
  multiplier = this_00 + bytes;
  if (multiplier <= (StringUtil *)this->max_swap_space) {
    LOCK();
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + bytes;
    UNLOCK();
    return;
  }
  StringUtil::BytesToHumanReadableString_abi_cxx11_((string *)&used,this_00,0x400,(idx_t)multiplier)
  ;
  StringUtil::BytesToHumanReadableString_abi_cxx11_
            ((string *)&max,(StringUtil *)this->max_swap_space,0x400,(idx_t)multiplier);
  StringUtil::BytesToHumanReadableString_abi_cxx11_
            ((string *)&data_size,(StringUtil *)bytes,0x400,(idx_t)multiplier);
  this_01 = (OutOfMemoryException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_98,
             "failed to offload data block of size %s (%s/%s used).\nThis limit was set by the \'max_temp_directory_size\' setting.\nBy default, this setting utilizes the available disk space on the drive where the \'temp_directory\' is located.\nYou can adjust this setting, by using (for example) PRAGMA max_temp_directory_size=\'10GiB\'"
             ,&local_f9);
  ::std::__cxx11::string::string((string *)&local_b8,(string *)&data_size);
  ::std::__cxx11::string::string((string *)&local_d8,(string *)&used);
  ::std::__cxx11::string::string((string *)&local_f8,(string *)&max);
  OutOfMemoryException::
  OutOfMemoryException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this_01,&local_98,&local_b8,&local_d8,&local_f8);
  __cxa_throw(this_01,&OutOfMemoryException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void TemporaryFileManager::IncreaseSizeOnDisk(idx_t bytes) {
	auto current_size_on_disk = GetTotalUsedSpaceInBytes();
	if (current_size_on_disk + bytes > max_swap_space) {
		auto used = StringUtil::BytesToHumanReadableString(current_size_on_disk);
		auto max = StringUtil::BytesToHumanReadableString(max_swap_space);
		auto data_size = StringUtil::BytesToHumanReadableString(bytes);
		throw OutOfMemoryException(R"(failed to offload data block of size %s (%s/%s used).
This limit was set by the 'max_temp_directory_size' setting.
By default, this setting utilizes the available disk space on the drive where the 'temp_directory' is located.
You can adjust this setting, by using (for example) PRAGMA max_temp_directory_size='10GiB')",
		                           data_size, used, max);
	}
	size_on_disk += bytes;
}